

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4e1151::Handlers::initHandlers(Handlers *this)

{
  pointer *ppsVar1;
  JSONHandler **ppJVar2;
  JSONHandler *this_00;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  logic_error *this_01;
  undefined1 local_1508 [16];
  undefined1 local_14f8 [31];
  undefined1 local_14d9;
  _Any_data local_14d8;
  code *local_14c8;
  code *pcStack_14c0;
  _Any_data local_14b8;
  code *local_14a8;
  code *pcStack_14a0;
  _Any_data local_1498;
  code *local_1488;
  code *pcStack_1480;
  _Any_data local_1478;
  code *local_1468;
  code *pcStack_1460;
  _Any_data local_1458;
  code *local_1448;
  code *pcStack_1440;
  _Any_data local_1438;
  code *local_1428;
  code *pcStack_1420;
  _Any_data local_1418;
  code *local_1408;
  code *pcStack_1400;
  _Any_data local_13f8;
  code *local_13e8;
  code *pcStack_13e0;
  _Any_data local_13d8;
  code *local_13c8;
  code *pcStack_13c0;
  _Any_data local_13b8;
  code *local_13a8;
  code *pcStack_13a0;
  _Any_data local_1398;
  code *local_1388;
  code *pcStack_1380;
  _Any_data local_1378;
  code *local_1368;
  code *pcStack_1360;
  _Any_data local_1358;
  code *local_1348;
  code *pcStack_1340;
  _Any_data local_1338;
  code *local_1328;
  code *pcStack_1320;
  _Any_data local_1318;
  code *local_1308;
  code *pcStack_1300;
  _Any_data local_12f8;
  code *local_12e8;
  code *pcStack_12e0;
  _Any_data local_12d8;
  code *local_12c8;
  code *pcStack_12c0;
  _Any_data local_12b8;
  code *local_12a8;
  code *pcStack_12a0;
  _Any_data local_1298;
  code *local_1288;
  code *pcStack_1280;
  _Any_data local_1278;
  code *local_1268;
  code *pcStack_1260;
  _Any_data local_1258;
  code *local_1248;
  code *pcStack_1240;
  _Any_data local_1238;
  code *local_1228;
  code *pcStack_1220;
  _Any_data local_1218;
  code *local_1208;
  code *pcStack_1200;
  _Any_data local_11f8;
  code *local_11e8;
  code *pcStack_11e0;
  _Any_data local_11d8;
  code *local_11c8;
  code *pcStack_11c0;
  _Any_data local_11b8;
  code *local_11a8;
  code *pcStack_11a0;
  _Any_data local_1198;
  code *local_1188;
  code *pcStack_1180;
  _Any_data local_1178;
  code *local_1168;
  code *pcStack_1160;
  _Any_data local_1158;
  code *local_1148;
  code *pcStack_1140;
  _Any_data local_1138;
  code *local_1128;
  code *pcStack_1120;
  _Any_data local_1118;
  code *local_1108;
  code *pcStack_1100;
  _Any_data local_10f8;
  code *local_10e8;
  code *pcStack_10e0;
  _Any_data local_10d8;
  code *local_10c8;
  code *pcStack_10c0;
  _Any_data local_10b8;
  code *local_10a8;
  code *pcStack_10a0;
  _Any_data local_1098;
  code *local_1088;
  code *pcStack_1080;
  _Any_data local_1078;
  code *local_1068;
  code *pcStack_1060;
  _Any_data local_1058;
  code *local_1048;
  code *pcStack_1040;
  _Any_data local_1038;
  code *local_1028;
  code *pcStack_1020;
  _Any_data local_1018;
  code *local_1008;
  code *pcStack_1000;
  _Any_data local_ff8;
  code *local_fe8;
  code *pcStack_fe0;
  _Any_data local_fd8;
  code *local_fc8;
  code *pcStack_fc0;
  _Any_data local_fb8;
  code *local_fa8;
  code *pcStack_fa0;
  _Any_data local_f98;
  code *local_f88;
  code *pcStack_f80;
  _Any_data local_f78;
  code *local_f68;
  code *pcStack_f60;
  _Any_data local_f58;
  code *local_f48;
  code *pcStack_f40;
  _Any_data local_f38;
  code *local_f28;
  code *pcStack_f20;
  _Any_data local_f18;
  code *local_f08;
  code *pcStack_f00;
  _Any_data local_ef8;
  code *local_ee8;
  code *pcStack_ee0;
  _Any_data local_ed8;
  code *local_ec8;
  code *pcStack_ec0;
  _Any_data local_eb8;
  code *local_ea8;
  code *pcStack_ea0;
  _Any_data local_e98;
  code *local_e88;
  code *pcStack_e80;
  _Any_data local_e78;
  code *local_e68;
  code *pcStack_e60;
  _Any_data local_e58;
  code *local_e48;
  code *pcStack_e40;
  _Any_data local_e38;
  code *local_e28;
  code *pcStack_e20;
  _Any_data local_e18;
  code *local_e08;
  code *pcStack_e00;
  _Any_data local_df8;
  code *local_de8;
  code *pcStack_de0;
  _Any_data local_dd8;
  code *local_dc8;
  code *pcStack_dc0;
  _Any_data local_db8;
  code *local_da8;
  code *pcStack_da0;
  _Any_data local_d98;
  code *local_d88;
  code *pcStack_d80;
  _Any_data local_d78;
  code *local_d68;
  code *pcStack_d60;
  _Any_data local_d58;
  code *local_d48;
  code *pcStack_d40;
  _Any_data local_d38;
  code *local_d28;
  code *pcStack_d20;
  _Any_data local_d18;
  code *local_d08;
  code *pcStack_d00;
  _Any_data local_cf8;
  code *local_ce8;
  code *pcStack_ce0;
  _Any_data local_cd8;
  code *local_cc8;
  code *pcStack_cc0;
  _Any_data local_cb8;
  code *local_ca8;
  code *pcStack_ca0;
  _Any_data local_c98;
  code *local_c88;
  code *pcStack_c80;
  _Any_data local_c78;
  code *local_c68;
  code *pcStack_c60;
  _Any_data local_c58;
  code *local_c48;
  code *pcStack_c40;
  _Any_data local_c38;
  code *local_c28;
  code *pcStack_c20;
  _Any_data local_c18;
  code *local_c08;
  code *pcStack_c00;
  _Any_data local_bf8;
  code *local_be8;
  code *pcStack_be0;
  _Any_data local_bd8;
  code *local_bc8;
  code *pcStack_bc0;
  _Any_data local_bb8;
  code *local_ba8;
  code *pcStack_ba0;
  _Any_data local_b98;
  code *local_b88;
  code *pcStack_b80;
  _Any_data local_b78;
  code *local_b68;
  code *pcStack_b60;
  _Any_data local_b58;
  code *local_b48;
  code *pcStack_b40;
  _Any_data local_b38;
  code *local_b28;
  code *pcStack_b20;
  _Any_data local_b18;
  code *local_b08;
  code *pcStack_b00;
  _Any_data local_af8;
  code *local_ae8;
  code *pcStack_ae0;
  _Any_data local_ad8;
  code *local_ac8;
  code *pcStack_ac0;
  _Any_data local_ab8;
  code *local_aa8;
  code *pcStack_aa0;
  _Any_data local_a98;
  code *local_a88;
  code *pcStack_a80;
  _Any_data local_a78;
  code *local_a68;
  code *pcStack_a60;
  _Any_data local_a58;
  code *local_a48;
  code *pcStack_a40;
  _Any_data local_a38;
  code *local_a28;
  code *pcStack_a20;
  _Any_data local_a18;
  code *local_a08;
  code *pcStack_a00;
  _Any_data local_9f8;
  code *local_9e8;
  code *pcStack_9e0;
  _Any_data local_9d8;
  code *local_9c8;
  code *pcStack_9c0;
  _Any_data local_9b8;
  code *local_9a8;
  code *pcStack_9a0;
  _Any_data local_998;
  code *local_988;
  code *pcStack_980;
  _Any_data local_978;
  code *local_968;
  code *pcStack_960;
  _Any_data local_958;
  code *local_948;
  code *pcStack_940;
  _Any_data local_938;
  code *local_928;
  code *pcStack_920;
  _Any_data local_918;
  code *local_908;
  code *pcStack_900;
  _Any_data local_8f8;
  code *local_8e8;
  code *pcStack_8e0;
  _Any_data local_8d8;
  code *local_8c8;
  code *pcStack_8c0;
  _Any_data local_8b8;
  code *local_8a8;
  code *pcStack_8a0;
  _Any_data local_898;
  code *local_888;
  code *pcStack_880;
  _Any_data local_878;
  code *local_868;
  code *pcStack_860;
  _Any_data local_858;
  code *local_848;
  code *pcStack_840;
  _Any_data local_838;
  code *local_828;
  code *pcStack_820;
  _Any_data local_818;
  code *local_808;
  code *pcStack_800;
  _Any_data local_7f8;
  code *local_7e8;
  code *pcStack_7e0;
  _Any_data local_7d8;
  code *local_7c8;
  code *pcStack_7c0;
  _Any_data local_7b8;
  code *local_7a8;
  code *pcStack_7a0;
  _Any_data local_798;
  code *local_788;
  code *pcStack_780;
  _Any_data local_778;
  code *local_768;
  code *pcStack_760;
  _Any_data local_758;
  code *local_748;
  code *pcStack_740;
  _Any_data local_738;
  code *local_728;
  code *pcStack_720;
  _Any_data local_718;
  code *local_708;
  code *pcStack_700;
  _Any_data local_6f8;
  code *local_6e8;
  code *pcStack_6e0;
  _Any_data local_6d8;
  code *local_6c8;
  code *pcStack_6c0;
  _Any_data local_6b8;
  code *local_6a8;
  code *pcStack_6a0;
  _Any_data local_698;
  code *local_688;
  code *pcStack_680;
  _Any_data local_678;
  code *local_668;
  code *pcStack_660;
  _Any_data local_658;
  code *local_648;
  code *pcStack_640;
  _Any_data local_638;
  code *local_628;
  code *pcStack_620;
  _Any_data local_618;
  code *local_608;
  code *pcStack_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *pcStack_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *pcStack_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *pcStack_5a0;
  _Any_data local_598;
  code *local_588;
  code *pcStack_580;
  _Any_data local_578;
  code *local_568;
  code *pcStack_560;
  _Any_data local_558;
  code *local_548;
  code *pcStack_540;
  _Any_data local_538;
  code *local_528;
  code *pcStack_520;
  _Any_data local_518;
  code *local_508;
  code *pcStack_500;
  _Any_data local_4f8;
  code *local_4e8;
  code *pcStack_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *pcStack_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *pcStack_4a0;
  _Any_data local_498;
  code *local_488;
  code *pcStack_480;
  _Any_data local_478;
  code *local_468;
  code *pcStack_460;
  _Any_data local_458;
  code *local_448;
  code *pcStack_440;
  _Any_data local_438;
  code *local_428;
  code *pcStack_420;
  _Any_data local_418;
  code *local_408;
  code *pcStack_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *pcStack_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *pcStack_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *pcStack_3a0;
  _Any_data local_398;
  code *local_388;
  code *pcStack_380;
  _Any_data local_378;
  code *local_368;
  code *pcStack_360;
  _Any_data local_358;
  code *local_348;
  code *pcStack_340;
  _Any_data local_338;
  code *local_328;
  code *pcStack_320;
  _Any_data local_318;
  code *local_308;
  code *pcStack_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *pcStack_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *pcStack_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *pcStack_2a0;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_1508._0_8_ = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1508 + 8),
             (JSONHandler **)local_1508,(allocator<JSONHandler> *)&local_14d9);
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,(shared_ptr<JSONHandler> *)local_1508);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1508._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1508._8_8_);
  }
  this_00 = (this->json_handlers).
            super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->jh = this_00;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:106:9)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:106:9)>
             ::_M_manager;
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:107:9)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:107:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  JSONHandler::addDictHandlers(this_00,(json_handler_t *)&local_58,(void_handler_t *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"inputFile","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,local_14f8._0_8_ + 1);
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:246:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:246:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  ppsVar1 = &(this->json_handlers).
             super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppJVar2 = &this->jh;
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"password","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:252:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:252:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"passwordFile","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:30:14)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:30:14)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"empty","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:258:13)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:258:13)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addBare(this,(bare_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"jsonInput","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:36:9)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:36:9)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"outputFile","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:264:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:264:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"replaceInput","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:270:13)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:270:13)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addBare(this,(bare_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"qdf","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_d8._8_8_ = 0;
  pcStack_c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:45:9)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:45:9)>
             ::_M_manager;
  local_d8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"preserveUnreferenced","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_f8._8_8_ = 0;
  pcStack_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:48:9)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:48:9)>
             ::_M_manager;
  local_f8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"newlineBeforeEndstream","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_118._8_8_ = 0;
  pcStack_100 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:51:9)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:51:9)>
              ::_M_manager;
  local_118._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"normalizeContent","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_138._8_8_ = 0;
  pcStack_120 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:54:30)>
                ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:54:30)>
              ::_M_manager;
  local_138._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"streamData","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_158._8_8_ = 0;
  pcStack_140 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:57:39)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:57:39)>
              ::_M_manager;
  local_158._M_unused._M_object = this;
  addChoices(this,initHandlers::stream_data_choices,true,(param_handler_t *)&local_158);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"compressStreams","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_178._8_8_ = 0;
  pcStack_160 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:60:30)>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:60:30)>
              ::_M_manager;
  local_178._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_178);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"recompressFlate","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_198._8_8_ = 0;
  pcStack_180 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:63:9)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:63:9)>
              ::_M_manager;
  local_198._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_198);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"decodeLevel","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1b8._8_8_ = 0;
  pcStack_1a0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:66:40)>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:66:40)>
              ::_M_manager;
  local_1b8._M_unused._M_object = this;
  addChoices(this,initHandlers::decode_level_choices,true,(param_handler_t *)&local_1b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"decrypt","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1d8._8_8_ = 0;
  pcStack_1c0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:69:9)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:69:9)>
              ::_M_manager;
  local_1d8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1d8);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"deterministicId","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1f8._8_8_ = 0;
  pcStack_1e0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:72:9)>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:72:9)>
              ::_M_manager;
  local_1f8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1f8);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"staticAesIv","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_218._8_8_ = 0;
  pcStack_200 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:75:9)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:75:9)>
              ::_M_manager;
  local_218._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_218);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"staticId","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:78:9)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:78:9)>
              ::_M_manager;
  local_238._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_238);
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"noOriginalObjectIds","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_258._8_8_ = 0;
  pcStack_240 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:81:9)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:81:9)>
              ::_M_manager;
  local_258._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_258);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"copyEncryption","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_278._8_8_ = 0;
  pcStack_260 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:84:14)>
                ::_M_invoke;
  local_268 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:84:14)>
              ::_M_manager;
  local_278._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_278);
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"encryptionFilePassword","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_298._8_8_ = 0;
  pcStack_280 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:87:14)>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:87:14)>
              ::_M_manager;
  local_298._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_298);
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"linearize","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_2b8._8_8_ = 0;
  pcStack_2a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:90:9)>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:90:9)>
              ::_M_manager;
  local_2b8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_2b8);
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"linearizePass1","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_2d8._8_8_ = 0;
  pcStack_2c0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:93:14)>
                ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:93:14)>
              ::_M_manager;
  local_2d8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_2d8);
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"objectStreams","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_2f8._8_8_ = 0;
  pcStack_2e0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:96:42)>
                ::_M_invoke;
  local_2e8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:96:42)>
              ::_M_manager;
  local_2f8._M_unused._M_object = this;
  addChoices(this,initHandlers::object_streams_choices,true,(param_handler_t *)&local_2f8);
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"minVersion","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_318._8_8_ = 0;
  pcStack_300 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:99:14)>
                ::_M_invoke;
  local_308 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:99:14)>
              ::_M_manager;
  local_318._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_318);
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"forceVersion","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_338._8_8_ = 0;
  pcStack_320 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:102:14)>
                ::_M_invoke;
  local_328 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:102:14)>
              ::_M_manager;
  local_338._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_338);
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"progress","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_358._8_8_ = 0;
  pcStack_340 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:105:9)>
                ::_M_invoke;
  local_348 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:105:9)>
              ::_M_manager;
  local_358._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_358);
  if (local_348 != (code *)0x0) {
    (*local_348)(&local_358,&local_358,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"splitPages","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_378._8_8_ = 0;
  pcStack_360 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:108:14)>
                ::_M_invoke;
  local_368 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:108:14)>
              ::_M_manager;
  local_378._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_378);
  if (local_368 != (code *)0x0) {
    (*local_368)(&local_378,&local_378,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"jsonOutput","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_398._8_8_ = 0;
  pcStack_380 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:111:40)>
                ::_M_invoke;
  local_388 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:111:40)>
              ::_M_manager;
  local_398._M_unused._M_object = this;
  addChoices(this,initHandlers::json_output_choices,false,(param_handler_t *)&local_398);
  if (local_388 != (code *)0x0) {
    (*local_388)(&local_398,&local_398,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"removeRestrictions","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_3b8._8_8_ = 0;
  pcStack_3a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:114:9)>
                ::_M_invoke;
  local_3a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:114:9)>
              ::_M_manager;
  local_3b8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_3b8);
  if (local_3a8 != (code *)0x0) {
    (*local_3a8)(&local_3b8,&local_3b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"encrypt","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1298._M_unused._M_object = (void *)0x0;
  local_1298._8_8_ = 0;
  local_1288 = (code *)0x0;
  pcStack_1280 = (code *)0x0;
  local_1298._M_unused._M_object = operator_new(0x18);
  *(code **)local_1298._M_unused._0_8_ = beginEncrypt;
  *(undefined8 *)((long)local_1298._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1298._M_unused._0_8_ + 0x10) = this;
  pcStack_1280 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1288 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1028 = (code *)0x0;
  pcStack_1020 = (code *)0x0;
  local_1038._M_unused._M_object = (void *)0x0;
  local_1038._8_8_ = 0;
  local_1038._M_unused._M_object = operator_new(0x18);
  *(code **)local_1038._M_unused._0_8_ = endEncrypt;
  *(undefined8 *)((long)local_1038._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1038._M_unused._0_8_ + 0x10) = this;
  pcStack_1020 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1028 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_1298,(bare_handler_t *)&local_1038);
  if (local_1028 != (code *)0x0) {
    (*local_1028)(&local_1038,&local_1038,__destroy_functor);
  }
  if (local_1288 != (code *)0x0) {
    (*local_1288)(&local_1298,&local_1298,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"userPassword","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  ignoreItem(this);
  psVar3 = (this->json_handlers).
           super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->json_handlers).
  super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"ownerPassword","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  ignoreItem(this);
  psVar3 = (this->json_handlers).
           super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->json_handlers).
  super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"Bits","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"40bit","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_12b8._M_unused._M_object = (void *)0x0;
  local_12b8._8_8_ = 0;
  local_12a8 = (code *)0x0;
  pcStack_12a0 = (code *)0x0;
  local_12b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_12b8._M_unused._0_8_ = beginEncrypt40bit;
  *(undefined8 *)((long)local_12b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_12b8._M_unused._0_8_ + 0x10) = this;
  pcStack_12a0 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_12a8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1048 = (code *)0x0;
  pcStack_1040 = (code *)0x0;
  local_1058._M_unused._M_object = (void *)0x0;
  local_1058._8_8_ = 0;
  local_1058._M_unused._M_object = operator_new(0x18);
  *(code **)local_1058._M_unused._0_8_ = endEncrypt40bit;
  *(undefined8 *)((long)local_1058._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1058._M_unused._0_8_ + 0x10) = this;
  pcStack_1040 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1048 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_12b8,(bare_handler_t *)&local_1058);
  if (local_1048 != (code *)0x0) {
    (*local_1048)(&local_1058,&local_1058,__destroy_functor);
  }
  if (local_12a8 != (code *)0x0) {
    (*local_12a8)(&local_12b8,&local_12b8,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"annotate","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_3d8._8_8_ = 0;
  pcStack_3c0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:129:30)>
                ::_M_invoke;
  local_3c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:129:30)>
              ::_M_manager;
  local_3d8._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_3d8);
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"extract","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_3f8._8_8_ = 0;
  pcStack_3e0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:132:30)>
                ::_M_invoke;
  local_3e8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:132:30)>
              ::_M_manager;
  local_3f8._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_3f8);
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"modify","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_418._8_8_ = 0;
  pcStack_400 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:135:37)>
                ::_M_invoke;
  local_408 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:135:37)>
              ::_M_manager;
  local_418._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_418);
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"print","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_438._8_8_ = 0;
  pcStack_420 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:138:36)>
                ::_M_invoke;
  local_428 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:138:36)>
              ::_M_manager;
  local_438._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_438);
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"128bit","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_12d8._M_unused._M_object = (void *)0x0;
  local_12d8._8_8_ = 0;
  local_12c8 = (code *)0x0;
  pcStack_12c0 = (code *)0x0;
  local_12d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_12d8._M_unused._0_8_ = beginEncrypt128bit;
  *(undefined8 *)((long)local_12d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_12d8._M_unused._0_8_ + 0x10) = this;
  pcStack_12c0 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_12c8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1068 = (code *)0x0;
  pcStack_1060 = (code *)0x0;
  local_1078._M_unused._M_object = (void *)0x0;
  local_1078._8_8_ = 0;
  local_1078._M_unused._M_object = operator_new(0x18);
  *(code **)local_1078._M_unused._0_8_ = endEncrypt128bit;
  *(undefined8 *)((long)local_1078._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1078._M_unused._0_8_ + 0x10) = this;
  pcStack_1060 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1068 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_12d8,(bare_handler_t *)&local_1078);
  if (local_1068 != (code *)0x0) {
    (*local_1068)(&local_1078,&local_1078,__destroy_functor);
  }
  if (local_12c8 != (code *)0x0) {
    (*local_12c8)(&local_12d8,&local_12d8,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"accessibility","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_458._8_8_ = 0;
  pcStack_440 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:144:30)>
                ::_M_invoke;
  local_448 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:144:30)>
              ::_M_manager;
  local_458._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_458);
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"annotate","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_478._8_8_ = 0;
  pcStack_460 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:147:30)>
                ::_M_invoke;
  local_468 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:147:30)>
              ::_M_manager;
  local_478._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_478);
  if (local_468 != (code *)0x0) {
    (*local_468)(&local_478,&local_478,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"assemble","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_498._8_8_ = 0;
  pcStack_480 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:150:30)>
                ::_M_invoke;
  local_488 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:150:30)>
              ::_M_manager;
  local_498._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_498);
  if (local_488 != (code *)0x0) {
    (*local_488)(&local_498,&local_498,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"cleartextMetadata","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_4b8._8_8_ = 0;
  pcStack_4a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:153:9)>
                ::_M_invoke;
  local_4a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:153:9)>
              ::_M_manager;
  local_4b8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_4b8);
  if (local_4a8 != (code *)0x0) {
    (*local_4a8)(&local_4b8,&local_4b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"extract","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_4d8._8_8_ = 0;
  pcStack_4c0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:156:30)>
                ::_M_invoke;
  local_4c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:156:30)>
              ::_M_manager;
  local_4d8._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_4d8);
  if (local_4c8 != (code *)0x0) {
    (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"form","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_4f8._8_8_ = 0;
  pcStack_4e0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:159:30)>
                ::_M_invoke;
  local_4e8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:159:30)>
              ::_M_manager;
  local_4f8._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_4f8);
  if (local_4e8 != (code *)0x0) {
    (*local_4e8)(&local_4f8,&local_4f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"modifyOther","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_518._8_8_ = 0;
  pcStack_500 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:162:30)>
                ::_M_invoke;
  local_508 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:162:30)>
              ::_M_manager;
  local_518._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_518);
  if (local_508 != (code *)0x0) {
    (*local_508)(&local_518,&local_518,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"modify","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_538._8_8_ = 0;
  pcStack_520 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:165:37)>
                ::_M_invoke;
  local_528 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:165:37)>
              ::_M_manager;
  local_538._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_538);
  if (local_528 != (code *)0x0) {
    (*local_528)(&local_538,&local_538,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"print","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_558._8_8_ = 0;
  pcStack_540 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:168:36)>
                ::_M_invoke;
  local_548 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:168:36)>
              ::_M_manager;
  local_558._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_558);
  if (local_548 != (code *)0x0) {
    (*local_548)(&local_558,&local_558,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"forceV4","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_578._8_8_ = 0;
  pcStack_560 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:171:9)>
                ::_M_invoke;
  local_568 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:171:9)>
              ::_M_manager;
  local_578._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_578);
  if (local_568 != (code *)0x0) {
    (*local_568)(&local_578,&local_578,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"useAes","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_598._8_8_ = 0;
  pcStack_580 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:174:30)>
                ::_M_invoke;
  local_588 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:174:30)>
              ::_M_manager;
  local_598._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_598);
  if (local_588 != (code *)0x0) {
    (*local_588)(&local_598,&local_598,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"256bit","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_12f8._M_unused._M_object = (void *)0x0;
  local_12f8._8_8_ = 0;
  local_12e8 = (code *)0x0;
  pcStack_12e0 = (code *)0x0;
  local_12f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_12f8._M_unused._0_8_ = beginEncrypt256bit;
  *(undefined8 *)((long)local_12f8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_12f8._M_unused._0_8_ + 0x10) = this;
  pcStack_12e0 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_12e8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1088 = (code *)0x0;
  pcStack_1080 = (code *)0x0;
  local_1098._M_unused._M_object = (void *)0x0;
  local_1098._8_8_ = 0;
  local_1098._M_unused._M_object = operator_new(0x18);
  *(code **)local_1098._M_unused._0_8_ = endEncrypt256bit;
  *(undefined8 *)((long)local_1098._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1098._M_unused._0_8_ + 0x10) = this;
  pcStack_1080 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1088 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_12f8,(bare_handler_t *)&local_1098);
  if (local_1088 != (code *)0x0) {
    (*local_1088)(&local_1098,&local_1098,__destroy_functor);
  }
  if (local_12e8 != (code *)0x0) {
    (*local_12e8)(&local_12f8,&local_12f8,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"accessibility","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_5b8._8_8_ = 0;
  pcStack_5a0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:180:30)>
                ::_M_invoke;
  local_5a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:180:30)>
              ::_M_manager;
  local_5b8._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_5b8);
  if (local_5a8 != (code *)0x0) {
    (*local_5a8)(&local_5b8,&local_5b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"annotate","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_5d8._8_8_ = 0;
  pcStack_5c0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:183:30)>
                ::_M_invoke;
  local_5c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:183:30)>
              ::_M_manager;
  local_5d8._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_5d8);
  if (local_5c8 != (code *)0x0) {
    (*local_5c8)(&local_5d8,&local_5d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"assemble","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_5f8._8_8_ = 0;
  pcStack_5e0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:186:30)>
                ::_M_invoke;
  local_5e8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:186:30)>
              ::_M_manager;
  local_5f8._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_5f8);
  if (local_5e8 != (code *)0x0) {
    (*local_5e8)(&local_5f8,&local_5f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"cleartextMetadata","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_618._8_8_ = 0;
  pcStack_600 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:189:9)>
                ::_M_invoke;
  local_608 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:189:9)>
              ::_M_manager;
  local_618._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_618);
  if (local_608 != (code *)0x0) {
    (*local_608)(&local_618,&local_618,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"extract","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_638._8_8_ = 0;
  pcStack_620 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:192:30)>
                ::_M_invoke;
  local_628 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:192:30)>
              ::_M_manager;
  local_638._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_638);
  if (local_628 != (code *)0x0) {
    (*local_628)(&local_638,&local_638,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"form","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_658._8_8_ = 0;
  pcStack_640 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:195:30)>
                ::_M_invoke;
  local_648 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:195:30)>
              ::_M_manager;
  local_658._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_658);
  if (local_648 != (code *)0x0) {
    (*local_648)(&local_658,&local_658,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"modifyOther","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_678._8_8_ = 0;
  pcStack_660 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:198:30)>
                ::_M_invoke;
  local_668 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:198:30)>
              ::_M_manager;
  local_678._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_678);
  if (local_668 != (code *)0x0) {
    (*local_668)(&local_678,&local_678,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"modify","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_698._8_8_ = 0;
  pcStack_680 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:201:37)>
                ::_M_invoke;
  local_688 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:201:37)>
              ::_M_manager;
  local_698._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_698);
  if (local_688 != (code *)0x0) {
    (*local_688)(&local_698,&local_698,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"print","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_6b8._8_8_ = 0;
  pcStack_6a0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:204:36)>
                ::_M_invoke;
  local_6a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:204:36)>
              ::_M_manager;
  local_6b8._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_6b8);
  if (local_6a8 != (code *)0x0) {
    (*local_6a8)(&local_6b8,&local_6b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"allowInsecure","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_6d8._8_8_ = 0;
  pcStack_6c0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:207:9)>
                ::_M_invoke;
  local_6c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:207:9)>
              ::_M_manager;
  local_6d8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_6d8);
  if (local_6c8 != (code *)0x0) {
    (*local_6c8)(&local_6d8,&local_6d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"forceR5","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_6f8._8_8_ = 0;
  pcStack_6e0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:210:9)>
                ::_M_invoke;
  local_6e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:210:9)>
              ::_M_manager;
  local_6f8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_6f8);
  if (local_6e8 != (code *)0x0) {
    (*local_6e8)(&local_6f8,&local_6f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"check","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_718._8_8_ = 0;
  pcStack_700 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:215:9)>
                ::_M_invoke;
  local_708 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:215:9)>
              ::_M_manager;
  local_718._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_718);
  if (local_708 != (code *)0x0) {
    (*local_708)(&local_718,&local_718,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"checkLinearization","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_738._8_8_ = 0;
  pcStack_720 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:218:9)>
                ::_M_invoke;
  local_728 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:218:9)>
              ::_M_manager;
  local_738._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_738);
  if (local_728 != (code *)0x0) {
    (*local_728)(&local_738,&local_738,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"filteredStreamData","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_758._8_8_ = 0;
  pcStack_740 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:221:9)>
                ::_M_invoke;
  local_748 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:221:9)>
              ::_M_manager;
  local_758._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_758);
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"rawStreamData","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_778._8_8_ = 0;
  pcStack_760 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:224:9)>
                ::_M_invoke;
  local_768 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:224:9)>
              ::_M_manager;
  local_778._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_778);
  if (local_768 != (code *)0x0) {
    (*local_768)(&local_778,&local_778,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"showEncryption","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_798._8_8_ = 0;
  pcStack_780 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:227:9)>
                ::_M_invoke;
  local_788 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:227:9)>
              ::_M_manager;
  local_798._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_798);
  if (local_788 != (code *)0x0) {
    (*local_788)(&local_798,&local_798,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"showEncryptionKey","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_7b8._8_8_ = 0;
  pcStack_7a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:230:9)>
                ::_M_invoke;
  local_7a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:230:9)>
              ::_M_manager;
  local_7b8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_7b8);
  if (local_7a8 != (code *)0x0) {
    (*local_7a8)(&local_7b8,&local_7b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"showLinearization","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_7d8._8_8_ = 0;
  pcStack_7c0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:233:9)>
                ::_M_invoke;
  local_7c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:233:9)>
              ::_M_manager;
  local_7d8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_7d8);
  if (local_7c8 != (code *)0x0) {
    (*local_7c8)(&local_7d8,&local_7d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"showNpages","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_7f8._8_8_ = 0;
  pcStack_7e0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:236:9)>
                ::_M_invoke;
  local_7e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:236:9)>
              ::_M_manager;
  local_7f8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_7f8);
  if (local_7e8 != (code *)0x0) {
    (*local_7e8)(&local_7f8,&local_7f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"showObject","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_818._8_8_ = 0;
  pcStack_800 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:239:14)>
                ::_M_invoke;
  local_808 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:239:14)>
              ::_M_manager;
  local_818._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_818);
  if (local_808 != (code *)0x0) {
    (*local_808)(&local_818,&local_818,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"showPages","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_838._8_8_ = 0;
  pcStack_820 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:242:9)>
                ::_M_invoke;
  local_828 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:242:9)>
              ::_M_manager;
  local_838._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_838);
  if (local_828 != (code *)0x0) {
    (*local_828)(&local_838,&local_838,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"showXref","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_858._8_8_ = 0;
  pcStack_840 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:245:9)>
                ::_M_invoke;
  local_848 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:245:9)>
              ::_M_manager;
  local_858._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_858);
  if (local_848 != (code *)0x0) {
    (*local_848)(&local_858,&local_858,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"withImages","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_878._8_8_ = 0;
  pcStack_860 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:248:9)>
                ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:248:9)>
              ::_M_manager;
  local_878._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_878);
  if (local_868 != (code *)0x0) {
    (*local_868)(&local_878,&local_878,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"listAttachments","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_898._8_8_ = 0;
  pcStack_880 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:251:9)>
                ::_M_invoke;
  local_888 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:251:9)>
              ::_M_manager;
  local_898._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_898);
  if (local_888 != (code *)0x0) {
    (*local_888)(&local_898,&local_898,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"showAttachment","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_8b8._8_8_ = 0;
  pcStack_8a0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:254:14)>
                ::_M_invoke;
  local_8a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:254:14)>
              ::_M_manager;
  local_8b8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_8b8);
  if (local_8a8 != (code *)0x0) {
    (*local_8a8)(&local_8b8,&local_8b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"json","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_8d8._8_8_ = 0;
  pcStack_8c0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:257:41)>
                ::_M_invoke;
  local_8c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:257:41)>
              ::_M_manager;
  local_8d8._M_unused._M_object = this;
  addChoices(this,initHandlers::json_version_choices,false,(param_handler_t *)&local_8d8);
  if (local_8c8 != (code *)0x0) {
    (*local_8c8)(&local_8d8,&local_8d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"jsonKey","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1318._M_unused._M_object = (void *)0x0;
  local_1318._8_8_ = 0;
  local_1308 = (code *)0x0;
  pcStack_1300 = (code *)0x0;
  local_1318._M_unused._M_object = operator_new(0x18);
  *(code **)local_1318._M_unused._0_8_ = beginJsonKeyArray;
  *(undefined8 *)((long)local_1318._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1318._M_unused._0_8_ + 0x10) = this;
  pcStack_1300 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1308 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_10a8 = (code *)0x0;
  pcStack_10a0 = (code *)0x0;
  local_10b8._M_unused._M_object = (void *)0x0;
  local_10b8._8_8_ = 0;
  local_10b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_10b8._M_unused._0_8_ = endJsonKeyArray;
  *(undefined8 *)((long)local_10b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_10b8._M_unused._0_8_ + 0x10) = this;
  pcStack_10a0 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_10a8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1318,(bare_handler_t *)&local_10b8);
  if (local_10a8 != (code *)0x0) {
    (*local_10a8)(&local_10b8,&local_10b8,__destroy_functor);
  }
  if (local_1308 != (code *)0x0) {
    (*local_1308)(&local_1318,&local_1318,__destroy_functor);
  }
  local_8f8._8_8_ = 0;
  pcStack_8e0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:261:36)>
                ::_M_invoke;
  local_8e8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:261:36)>
              ::_M_manager;
  local_8f8._M_unused._M_object = this;
  addChoices(this,initHandlers::json_key_choices,true,(param_handler_t *)&local_8f8);
  if (local_8e8 != (code *)0x0) {
    (*local_8e8)(&local_8f8,&local_8f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"jsonObject","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1338._M_unused._M_object = (void *)0x0;
  local_1338._8_8_ = 0;
  local_1328 = (code *)0x0;
  pcStack_1320 = (code *)0x0;
  local_1338._M_unused._M_object = operator_new(0x18);
  *(code **)local_1338._M_unused._0_8_ = beginJsonObjectArray;
  *(undefined8 *)((long)local_1338._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1338._M_unused._0_8_ + 0x10) = this;
  pcStack_1320 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1328 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_10c8 = (code *)0x0;
  pcStack_10c0 = (code *)0x0;
  local_10d8._M_unused._M_object = (void *)0x0;
  local_10d8._8_8_ = 0;
  local_10d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_10d8._M_unused._0_8_ = endJsonObjectArray;
  *(undefined8 *)((long)local_10d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_10d8._M_unused._0_8_ + 0x10) = this;
  pcStack_10c0 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_10c8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1338,(bare_handler_t *)&local_10d8);
  if (local_10c8 != (code *)0x0) {
    (*local_10c8)(&local_10d8,&local_10d8,__destroy_functor);
  }
  if (local_1328 != (code *)0x0) {
    (*local_1328)(&local_1338,&local_1338,__destroy_functor);
  }
  local_918._8_8_ = 0;
  pcStack_900 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:266:14)>
                ::_M_invoke;
  local_908 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:266:14)>
              ::_M_manager;
  local_918._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_918);
  if (local_908 != (code *)0x0) {
    (*local_908)(&local_918,&local_918,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"jsonStreamData","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_938._8_8_ = 0;
  pcStack_920 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:270:44)>
                ::_M_invoke;
  local_928 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:270:44)>
              ::_M_manager;
  local_938._M_unused._M_object = this;
  addChoices(this,initHandlers::json_stream_data_choices,true,(param_handler_t *)&local_938);
  if (local_928 != (code *)0x0) {
    (*local_928)(&local_938,&local_938,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"jsonStreamPrefix","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_958._8_8_ = 0;
  pcStack_940 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:273:14)>
                ::_M_invoke;
  local_948 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:273:14)>
              ::_M_manager;
  local_958._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_958);
  if (local_948 != (code *)0x0) {
    (*local_948)(&local_958,&local_958,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"updateFromJson","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_978._8_8_ = 0;
  pcStack_960 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:276:14)>
                ::_M_invoke;
  local_968 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:276:14)>
              ::_M_manager;
  local_978._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_978);
  if (local_968 != (code *)0x0) {
    (*local_968)(&local_978,&local_978,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"allowWeakCrypto","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_998._8_8_ = 0;
  pcStack_980 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:279:9)>
                ::_M_invoke;
  local_988 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:279:9)>
              ::_M_manager;
  local_998._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_998);
  if (local_988 != (code *)0x0) {
    (*local_988)(&local_998,&local_998,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"keepFilesOpen","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_9b8._8_8_ = 0;
  pcStack_9a0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:282:30)>
                ::_M_invoke;
  local_9a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:282:30)>
              ::_M_manager;
  local_9b8._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_9b8);
  if (local_9a8 != (code *)0x0) {
    (*local_9a8)(&local_9b8,&local_9b8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"keepFilesOpenThreshold","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_9d8._8_8_ = 0;
  pcStack_9c0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:285:14)>
                ::_M_invoke;
  local_9c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:285:14)>
              ::_M_manager;
  local_9d8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_9d8);
  if (local_9c8 != (code *)0x0) {
    (*local_9c8)(&local_9d8,&local_9d8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"noWarn","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_9f8._8_8_ = 0;
  pcStack_9e0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:288:9)>
                ::_M_invoke;
  local_9e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:288:9)>
              ::_M_manager;
  local_9f8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_9f8);
  if (local_9e8 != (code *)0x0) {
    (*local_9e8)(&local_9f8,&local_9f8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"verbose","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_a18._8_8_ = 0;
  pcStack_a00 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:291:9)>
                ::_M_invoke;
  local_a08 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:291:9)>
              ::_M_manager;
  local_a18._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a18);
  if (local_a08 != (code *)0x0) {
    (*local_a08)(&local_a18,&local_a18,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"testJsonSchema","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_a38._8_8_ = 0;
  pcStack_a20 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:294:9)>
                ::_M_invoke;
  local_a28 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:294:9)>
              ::_M_manager;
  local_a38._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a38);
  if (local_a28 != (code *)0x0) {
    (*local_a28)(&local_a38,&local_a38,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"ignoreXrefStreams","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_a58._8_8_ = 0;
  pcStack_a40 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:297:9)>
                ::_M_invoke;
  local_a48 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:297:9)>
              ::_M_manager;
  local_a58._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a58);
  if (local_a48 != (code *)0x0) {
    (*local_a48)(&local_a58,&local_a58,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"passwordIsHexKey","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_a78._8_8_ = 0;
  pcStack_a60 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:300:9)>
                ::_M_invoke;
  local_a68 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:300:9)>
              ::_M_manager;
  local_a78._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a78);
  if (local_a68 != (code *)0x0) {
    (*local_a68)(&local_a78,&local_a78,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"passwordMode","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_a98._8_8_ = 0;
  pcStack_a80 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:303:41)>
                ::_M_invoke;
  local_a88 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:303:41)>
              ::_M_manager;
  local_a98._M_unused._M_object = this;
  addChoices(this,initHandlers::password_mode_choices,true,(param_handler_t *)&local_a98);
  if (local_a88 != (code *)0x0) {
    (*local_a88)(&local_a98,&local_a98,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1508,"suppressPasswordRecovery","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_ab8._8_8_ = 0;
  pcStack_aa0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:306:9)>
                ::_M_invoke;
  local_aa8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:306:9)>
              ::_M_manager;
  local_ab8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_ab8);
  if (local_aa8 != (code *)0x0) {
    (*local_aa8)(&local_ab8,&local_ab8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"suppressRecovery","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_ad8._8_8_ = 0;
  pcStack_ac0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:309:9)>
                ::_M_invoke;
  local_ac8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:309:9)>
              ::_M_manager;
  local_ad8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_ad8);
  if (local_ac8 != (code *)0x0) {
    (*local_ac8)(&local_ad8,&local_ad8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"coalesceContents","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_af8._8_8_ = 0;
  pcStack_ae0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:312:9)>
                ::_M_invoke;
  local_ae8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:312:9)>
              ::_M_manager;
  local_af8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_af8);
  if (local_ae8 != (code *)0x0) {
    (*local_ae8)(&local_af8,&local_af8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"compressionLevel","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_b18._8_8_ = 0;
  pcStack_b00 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:315:14)>
                ::_M_invoke;
  local_b08 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:315:14)>
              ::_M_manager;
  local_b18._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_b18);
  if (local_b08 != (code *)0x0) {
    (*local_b08)(&local_b18,&local_b18,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"jpegQuality","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_b38._8_8_ = 0;
  pcStack_b20 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:318:14)>
                ::_M_invoke;
  local_b28 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:318:14)>
              ::_M_manager;
  local_b38._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_b38);
  if (local_b28 != (code *)0x0) {
    (*local_b28)(&local_b38,&local_b38,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"externalizeInlineImages","")
  ;
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_b58._8_8_ = 0;
  pcStack_b40 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:321:9)>
                ::_M_invoke;
  local_b48 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:321:9)>
              ::_M_manager;
  local_b58._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_b58);
  if (local_b48 != (code *)0x0) {
    (*local_b48)(&local_b58,&local_b58,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"iiMinBytes","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_b78._8_8_ = 0;
  pcStack_b60 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:324:14)>
                ::_M_invoke;
  local_b68 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:324:14)>
              ::_M_manager;
  local_b78._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_b78);
  if (local_b68 != (code *)0x0) {
    (*local_b68)(&local_b78,&local_b78,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1508,"removeUnreferencedResources","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_b98._8_8_ = 0;
  pcStack_b80 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:327:40)>
                ::_M_invoke;
  local_b88 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:327:40)>
              ::_M_manager;
  local_b98._M_unused._M_object = this;
  addChoices(this,initHandlers::remove_unref_choices,true,(param_handler_t *)&local_b98);
  if (local_b88 != (code *)0x0) {
    (*local_b88)(&local_b98,&local_b98,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"addAttachment","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1358._M_unused._M_object = (void *)0x0;
  local_1358._8_8_ = 0;
  local_1348 = (code *)0x0;
  pcStack_1340 = (code *)0x0;
  local_1358._M_unused._M_object = operator_new(0x18);
  *(code **)local_1358._M_unused._0_8_ = beginAddAttachmentArray;
  *(undefined8 *)((long)local_1358._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1358._M_unused._0_8_ + 0x10) = this;
  pcStack_1340 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1348 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_10e8 = (code *)0x0;
  pcStack_10e0 = (code *)0x0;
  local_10f8._M_unused._M_object = (void *)0x0;
  local_10f8._8_8_ = 0;
  local_10f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_10f8._M_unused._0_8_ = endAddAttachmentArray;
  *(undefined8 *)((long)local_10f8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_10f8._M_unused._0_8_ + 0x10) = this;
  pcStack_10e0 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_10e8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1358,(bare_handler_t *)&local_10f8);
  if (local_10e8 != (code *)0x0) {
    (*local_10e8)(&local_10f8,&local_10f8,__destroy_functor);
  }
  if (local_1348 != (code *)0x0) {
    (*local_1348)(&local_1358,&local_1358,__destroy_functor);
  }
  local_1368 = (code *)0x0;
  pcStack_1360 = (code *)0x0;
  local_1378._M_unused._M_object = (void *)0x0;
  local_1378._8_8_ = 0;
  local_1378._M_unused._M_object = operator_new(0x18);
  *(code **)local_1378._M_unused._0_8_ = beginAddAttachment;
  *(undefined8 *)((long)local_1378._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1378._M_unused._0_8_ + 0x10) = this;
  pcStack_1360 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1368 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1108 = (code *)0x0;
  pcStack_1100 = (code *)0x0;
  local_1118._M_unused._M_object = (void *)0x0;
  local_1118._8_8_ = 0;
  local_1118._M_unused._M_object = operator_new(0x18);
  *(code **)local_1118._M_unused._0_8_ = endAddAttachment;
  *(undefined8 *)((long)local_1118._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1118._M_unused._0_8_ + 0x10) = this;
  pcStack_1100 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1108 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_1378,(bare_handler_t *)&local_1118);
  if (local_1108 != (code *)0x0) {
    (*local_1108)(&local_1118,&local_1118,__destroy_functor);
  }
  if (local_1368 != (code *)0x0) {
    (*local_1368)(&local_1378,&local_1378,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"file","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:420:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:420:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"creationdate","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_bb8._8_8_ = 0;
  pcStack_ba0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:336:14)>
                ::_M_invoke;
  local_ba8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:336:14)>
              ::_M_manager;
  local_bb8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_bb8);
  if (local_ba8 != (code *)0x0) {
    (*local_ba8)(&local_bb8,&local_bb8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"description","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_bd8._8_8_ = 0;
  pcStack_bc0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:339:14)>
                ::_M_invoke;
  local_bc8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:339:14)>
              ::_M_manager;
  local_bd8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_bd8);
  if (local_bc8 != (code *)0x0) {
    (*local_bc8)(&local_bd8,&local_bd8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"filename","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_bf8._8_8_ = 0;
  pcStack_be0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:342:14)>
                ::_M_invoke;
  local_be8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:342:14)>
              ::_M_manager;
  local_bf8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_bf8);
  if (local_be8 != (code *)0x0) {
    (*local_be8)(&local_bf8,&local_bf8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"key","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_c18._8_8_ = 0;
  pcStack_c00 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:345:14)>
                ::_M_invoke;
  local_c08 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:345:14)>
              ::_M_manager;
  local_c18._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_c18);
  if (local_c08 != (code *)0x0) {
    (*local_c08)(&local_c18,&local_c18,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"mimetype","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_c38._8_8_ = 0;
  pcStack_c20 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:348:14)>
                ::_M_invoke;
  local_c28 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:348:14)>
              ::_M_manager;
  local_c38._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_c38);
  if (local_c28 != (code *)0x0) {
    (*local_c28)(&local_c38,&local_c38,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"moddate","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_c58._8_8_ = 0;
  pcStack_c40 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:351:14)>
                ::_M_invoke;
  local_c48 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:351:14)>
              ::_M_manager;
  local_c58._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_c58);
  if (local_c48 != (code *)0x0) {
    (*local_c48)(&local_c58,&local_c58,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"replace","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_c78._8_8_ = 0;
  pcStack_c60 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:354:9)>
                ::_M_invoke;
  local_c68 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:354:9)>
              ::_M_manager;
  local_c78._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_c78);
  if (local_c68 != (code *)0x0) {
    (*local_c68)(&local_c78,&local_c78,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"removeAttachment","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1398._M_unused._M_object = (void *)0x0;
  local_1398._8_8_ = 0;
  local_1388 = (code *)0x0;
  pcStack_1380 = (code *)0x0;
  local_1398._M_unused._M_object = operator_new(0x18);
  *(code **)local_1398._M_unused._0_8_ = beginRemoveAttachmentArray;
  *(undefined8 *)((long)local_1398._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1398._M_unused._0_8_ + 0x10) = this;
  pcStack_1380 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1388 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1128 = (code *)0x0;
  pcStack_1120 = (code *)0x0;
  local_1138._M_unused._M_object = (void *)0x0;
  local_1138._8_8_ = 0;
  local_1138._M_unused._M_object = operator_new(0x18);
  *(code **)local_1138._M_unused._0_8_ = endRemoveAttachmentArray;
  *(undefined8 *)((long)local_1138._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1138._M_unused._0_8_ + 0x10) = this;
  pcStack_1120 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1128 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1398,(bare_handler_t *)&local_1138);
  if (local_1128 != (code *)0x0) {
    (*local_1128)(&local_1138,&local_1138,__destroy_functor);
  }
  if (local_1388 != (code *)0x0) {
    (*local_1388)(&local_1398,&local_1398,__destroy_functor);
  }
  local_c98._8_8_ = 0;
  pcStack_c80 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:360:14)>
                ::_M_invoke;
  local_c88 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:360:14)>
              ::_M_manager;
  local_c98._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_c98);
  if (local_c88 != (code *)0x0) {
    (*local_c88)(&local_c98,&local_c98,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"copyAttachmentsFrom","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_13b8._M_unused._M_object = (void *)0x0;
  local_13b8._8_8_ = 0;
  local_13a8 = (code *)0x0;
  pcStack_13a0 = (code *)0x0;
  local_13b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_13b8._M_unused._0_8_ = beginCopyAttachmentsFromArray;
  *(undefined8 *)((long)local_13b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_13b8._M_unused._0_8_ + 0x10) = this;
  pcStack_13a0 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_13a8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1148 = (code *)0x0;
  pcStack_1140 = (code *)0x0;
  local_1158._M_unused._M_object = (void *)0x0;
  local_1158._8_8_ = 0;
  local_1158._M_unused._M_object = operator_new(0x18);
  *(code **)local_1158._M_unused._0_8_ = endCopyAttachmentsFromArray;
  *(undefined8 *)((long)local_1158._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1158._M_unused._0_8_ + 0x10) = this;
  pcStack_1140 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1148 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_13b8,(bare_handler_t *)&local_1158);
  if (local_1148 != (code *)0x0) {
    (*local_1148)(&local_1158,&local_1158,__destroy_functor);
  }
  if (local_13a8 != (code *)0x0) {
    (*local_13a8)(&local_13b8,&local_13b8,__destroy_functor);
  }
  local_13c8 = (code *)0x0;
  pcStack_13c0 = (code *)0x0;
  local_13d8._M_unused._M_object = (void *)0x0;
  local_13d8._8_8_ = 0;
  local_13d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_13d8._M_unused._0_8_ = beginCopyAttachmentsFrom;
  *(undefined8 *)((long)local_13d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_13d8._M_unused._0_8_ + 0x10) = this;
  pcStack_13c0 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_13c8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1168 = (code *)0x0;
  pcStack_1160 = (code *)0x0;
  local_1178._M_unused._M_object = (void *)0x0;
  local_1178._8_8_ = 0;
  local_1178._M_unused._M_object = operator_new(0x18);
  *(code **)local_1178._M_unused._0_8_ = endCopyAttachmentsFrom;
  *(undefined8 *)((long)local_1178._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1178._M_unused._0_8_ + 0x10) = this;
  pcStack_1160 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1168 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_13d8,(bare_handler_t *)&local_1178);
  if (local_1168 != (code *)0x0) {
    (*local_1168)(&local_1178,&local_1178,__destroy_functor);
  }
  if (local_13c8 != (code *)0x0) {
    (*local_13c8)(&local_13d8,&local_13d8,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"file","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:462:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:462:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"password","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:468:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:468:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"prefix","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_cb8._8_8_ = 0;
  pcStack_ca0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:373:14)>
                ::_M_invoke;
  local_ca8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:373:14)>
              ::_M_manager;
  local_cb8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_cb8);
  if (local_ca8 != (code *)0x0) {
    (*local_ca8)(&local_cb8,&local_cb8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"collate","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_cd8._8_8_ = 0;
  pcStack_cc0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:378:14)>
                ::_M_invoke;
  local_cc8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:378:14)>
              ::_M_manager;
  local_cd8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_cd8);
  if (local_cc8 != (code *)0x0) {
    (*local_cc8)(&local_cd8,&local_cd8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"flattenAnnotations","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_cf8._8_8_ = 0;
  pcStack_ce0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:381:35)>
                ::_M_invoke;
  local_ce8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:381:35)>
              ::_M_manager;
  local_cf8._M_unused._M_object = this;
  addChoices(this,initHandlers::flatten_choices,true,(param_handler_t *)&local_cf8);
  if (local_ce8 != (code *)0x0) {
    (*local_ce8)(&local_cf8,&local_cf8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"flattenRotation","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_d18._8_8_ = 0;
  pcStack_d00 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:384:9)>
                ::_M_invoke;
  local_d08 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:384:9)>
              ::_M_manager;
  local_d18._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d18);
  if (local_d08 != (code *)0x0) {
    (*local_d08)(&local_d18,&local_d18,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"generateAppearances","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_d38._8_8_ = 0;
  pcStack_d20 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:387:9)>
                ::_M_invoke;
  local_d28 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:387:9)>
              ::_M_manager;
  local_d38._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d38);
  if (local_d28 != (code *)0x0) {
    (*local_d28)(&local_d38,&local_d38,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"keepInlineImages","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_d58._8_8_ = 0;
  pcStack_d40 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:390:9)>
                ::_M_invoke;
  local_d48 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:390:9)>
              ::_M_manager;
  local_d58._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d58);
  if (local_d48 != (code *)0x0) {
    (*local_d48)(&local_d58,&local_d58,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"oiMinArea","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_d78._8_8_ = 0;
  pcStack_d60 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:393:14)>
                ::_M_invoke;
  local_d68 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:393:14)>
              ::_M_manager;
  local_d78._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_d78);
  if (local_d68 != (code *)0x0) {
    (*local_d68)(&local_d78,&local_d78,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"oiMinHeight","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_d98._8_8_ = 0;
  pcStack_d80 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:396:14)>
                ::_M_invoke;
  local_d88 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:396:14)>
              ::_M_manager;
  local_d98._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_d98);
  if (local_d88 != (code *)0x0) {
    (*local_d88)(&local_d98,&local_d98,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"oiMinWidth","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_db8._8_8_ = 0;
  pcStack_da0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:399:14)>
                ::_M_invoke;
  local_da8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:399:14)>
              ::_M_manager;
  local_db8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_db8);
  if (local_da8 != (code *)0x0) {
    (*local_da8)(&local_db8,&local_db8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"optimizeImages","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_dd8._8_8_ = 0;
  pcStack_dc0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:402:9)>
                ::_M_invoke;
  local_dc8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:402:9)>
              ::_M_manager;
  local_dd8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_dd8);
  if (local_dc8 != (code *)0x0) {
    (*local_dc8)(&local_dd8,&local_dd8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"pages","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_13f8._M_unused._M_object = (void *)0x0;
  local_13f8._8_8_ = 0;
  local_13e8 = (code *)0x0;
  pcStack_13e0 = (code *)0x0;
  local_13f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_13f8._M_unused._0_8_ = beginPagesArray;
  *(undefined8 *)((long)local_13f8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_13f8._M_unused._0_8_ + 0x10) = this;
  pcStack_13e0 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_13e8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1188 = (code *)0x0;
  pcStack_1180 = (code *)0x0;
  local_1198._M_unused._M_object = (void *)0x0;
  local_1198._8_8_ = 0;
  local_1198._M_unused._M_object = operator_new(0x18);
  *(code **)local_1198._M_unused._0_8_ = endPagesArray;
  *(undefined8 *)((long)local_1198._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1198._M_unused._0_8_ + 0x10) = this;
  pcStack_1180 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1188 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_13f8,(bare_handler_t *)&local_1198);
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,__destroy_functor);
  }
  if (local_13e8 != (code *)0x0) {
    (*local_13e8)(&local_13f8,&local_13f8,__destroy_functor);
  }
  local_1408 = (code *)0x0;
  pcStack_1400 = (code *)0x0;
  local_1418._M_unused._M_object = (void *)0x0;
  local_1418._8_8_ = 0;
  local_1418._M_unused._M_object = operator_new(0x18);
  *(code **)local_1418._M_unused._0_8_ = beginPages;
  *(undefined8 *)((long)local_1418._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1418._M_unused._0_8_ + 0x10) = this;
  pcStack_1400 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1408 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_11a8 = (code *)0x0;
  pcStack_11a0 = (code *)0x0;
  local_11b8._M_unused._M_object = (void *)0x0;
  local_11b8._8_8_ = 0;
  local_11b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_11b8._M_unused._0_8_ = endPages;
  *(undefined8 *)((long)local_11b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_11b8._M_unused._0_8_ + 0x10) = this;
  pcStack_11a0 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_11a8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_1418,(bare_handler_t *)&local_11b8);
  if (local_11a8 != (code *)0x0) {
    (*local_11a8)(&local_11b8,&local_11b8,__destroy_functor);
  }
  if (local_1408 != (code *)0x0) {
    (*local_1408)(&local_1418,&local_1418,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"file","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  ignoreItem(this);
  psVar3 = (this->json_handlers).
           super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->json_handlers).
  super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"password","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:511:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:511:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"range","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_df8._8_8_ = 0;
  pcStack_de0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:414:14)>
                ::_M_invoke;
  local_de8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:414:14)>
              ::_M_manager;
  local_df8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_df8);
  if (local_de8 != (code *)0x0) {
    (*local_de8)(&local_df8,&local_df8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"removeInfo","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_e18._8_8_ = 0;
  pcStack_e00 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:419:9)>
                ::_M_invoke;
  local_e08 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:419:9)>
              ::_M_manager;
  local_e18._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e18);
  if (local_e08 != (code *)0x0) {
    (*local_e08)(&local_e18,&local_e18,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"removeMetadata","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_e38._8_8_ = 0;
  pcStack_e20 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:422:9)>
                ::_M_invoke;
  local_e28 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:422:9)>
              ::_M_manager;
  local_e38._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e38);
  if (local_e28 != (code *)0x0) {
    (*local_e28)(&local_e38,&local_e38,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"removePageLabels","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_e58._8_8_ = 0;
  pcStack_e40 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:425:9)>
                ::_M_invoke;
  local_e48 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:425:9)>
              ::_M_manager;
  local_e58._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e58);
  if (local_e48 != (code *)0x0) {
    (*local_e48)(&local_e58,&local_e58,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"removeStructure","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_e78._8_8_ = 0;
  pcStack_e60 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:428:9)>
                ::_M_invoke;
  local_e68 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:428:9)>
              ::_M_manager;
  local_e78._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e78);
  if (local_e68 != (code *)0x0) {
    (*local_e68)(&local_e78,&local_e78,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"reportMemoryUsage","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_e98._8_8_ = 0;
  pcStack_e80 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:431:9)>
                ::_M_invoke;
  local_e88 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:431:9)>
              ::_M_manager;
  local_e98._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e98);
  if (local_e88 != (code *)0x0) {
    (*local_e88)(&local_e98,&local_e98,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"rotate","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1438._M_unused._M_object = (void *)0x0;
  local_1438._8_8_ = 0;
  local_1428 = (code *)0x0;
  pcStack_1420 = (code *)0x0;
  local_1438._M_unused._M_object = operator_new(0x18);
  *(code **)local_1438._M_unused._0_8_ = beginRotateArray;
  *(undefined8 *)((long)local_1438._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1438._M_unused._0_8_ + 0x10) = this;
  pcStack_1420 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1428 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_11c8 = (code *)0x0;
  pcStack_11c0 = (code *)0x0;
  local_11d8._M_unused._M_object = (void *)0x0;
  local_11d8._8_8_ = 0;
  local_11d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_11d8._M_unused._0_8_ = endRotateArray;
  *(undefined8 *)((long)local_11d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_11d8._M_unused._0_8_ + 0x10) = this;
  pcStack_11c0 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_11c8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1438,(bare_handler_t *)&local_11d8);
  if (local_11c8 != (code *)0x0) {
    (*local_11c8)(&local_11d8,&local_11d8,__destroy_functor);
  }
  if (local_1428 != (code *)0x0) {
    (*local_1428)(&local_1438,&local_1438,__destroy_functor);
  }
  local_eb8._8_8_ = 0;
  pcStack_ea0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:435:14)>
                ::_M_invoke;
  local_ea8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:435:14)>
              ::_M_manager;
  local_eb8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_eb8);
  if (local_ea8 != (code *)0x0) {
    (*local_ea8)(&local_eb8,&local_eb8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"setPageLabels","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1458._M_unused._M_object = (void *)0x0;
  local_1458._8_8_ = 0;
  local_1448 = (code *)0x0;
  pcStack_1440 = (code *)0x0;
  local_1458._M_unused._M_object = operator_new(0x18);
  *(code **)local_1458._M_unused._0_8_ = beginSetPageLabelsArray;
  *(undefined8 *)((long)local_1458._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1458._M_unused._0_8_ + 0x10) = this;
  pcStack_1440 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1448 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_11e8 = (code *)0x0;
  pcStack_11e0 = (code *)0x0;
  local_11f8._M_unused._M_object = (void *)0x0;
  local_11f8._8_8_ = 0;
  local_11f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_11f8._M_unused._0_8_ = endSetPageLabelsArray;
  *(undefined8 *)((long)local_11f8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_11f8._M_unused._0_8_ + 0x10) = this;
  pcStack_11e0 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_11e8 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1458,(bare_handler_t *)&local_11f8);
  if (local_11e8 != (code *)0x0) {
    (*local_11e8)(&local_11f8,&local_11f8,__destroy_functor);
  }
  if (local_1448 != (code *)0x0) {
    (*local_1448)(&local_1458,&local_1458,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->accumulated_args,
                    (this->accumulated_args).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:608:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:608:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"overlay","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1478._M_unused._M_object = (void *)0x0;
  local_1478._8_8_ = 0;
  local_1468 = (code *)0x0;
  pcStack_1460 = (code *)0x0;
  local_1478._M_unused._M_object = operator_new(0x18);
  *(code **)local_1478._M_unused._0_8_ = beginOverlayArray;
  *(undefined8 *)((long)local_1478._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1478._M_unused._0_8_ + 0x10) = this;
  pcStack_1460 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1468 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1208 = (code *)0x0;
  pcStack_1200 = (code *)0x0;
  local_1218._M_unused._M_object = (void *)0x0;
  local_1218._8_8_ = 0;
  local_1218._M_unused._M_object = operator_new(0x18);
  *(code **)local_1218._M_unused._0_8_ = endOverlayArray;
  *(undefined8 *)((long)local_1218._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1218._M_unused._0_8_ + 0x10) = this;
  pcStack_1200 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1208 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_1478,(bare_handler_t *)&local_1218);
  if (local_1208 != (code *)0x0) {
    (*local_1208)(&local_1218,&local_1218,__destroy_functor);
  }
  if (local_1468 != (code *)0x0) {
    (*local_1468)(&local_1478,&local_1478,__destroy_functor);
  }
  local_1488 = (code *)0x0;
  pcStack_1480 = (code *)0x0;
  local_1498._M_unused._M_object = (void *)0x0;
  local_1498._8_8_ = 0;
  local_1498._M_unused._M_object = operator_new(0x18);
  *(code **)local_1498._M_unused._0_8_ = beginOverlay;
  *(undefined8 *)((long)local_1498._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1498._M_unused._0_8_ + 0x10) = this;
  pcStack_1480 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_1488 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1228 = (code *)0x0;
  pcStack_1220 = (code *)0x0;
  local_1238._M_unused._M_object = (void *)0x0;
  local_1238._8_8_ = 0;
  local_1238._M_unused._M_object = operator_new(0x18);
  *(code **)local_1238._M_unused._0_8_ = endOverlay;
  *(undefined8 *)((long)local_1238._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1238._M_unused._0_8_ + 0x10) = this;
  pcStack_1220 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1228 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_1498,(bare_handler_t *)&local_1238);
  if (local_1228 != (code *)0x0) {
    (*local_1228)(&local_1238,&local_1238,__destroy_functor);
  }
  if (local_1488 != (code *)0x0) {
    (*local_1488)(&local_1498,&local_1498,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"file","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  ignoreItem(this);
  psVar3 = (this->json_handlers).
           super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->json_handlers).
  super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"password","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:550:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:550:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"from","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_ed8._8_8_ = 0;
  pcStack_ec0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:453:14)>
                ::_M_invoke;
  local_ec8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:453:14)>
              ::_M_manager;
  local_ed8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_ed8);
  if (local_ec8 != (code *)0x0) {
    (*local_ec8)(&local_ed8,&local_ed8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"repeat","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_ef8._8_8_ = 0;
  pcStack_ee0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:456:14)>
                ::_M_invoke;
  local_ee8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:456:14)>
              ::_M_manager;
  local_ef8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_ef8);
  if (local_ee8 != (code *)0x0) {
    (*local_ee8)(&local_ef8,&local_ef8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"to","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_f18._8_8_ = 0;
  pcStack_f00 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:459:14)>
                ::_M_invoke;
  local_f08 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:459:14)>
              ::_M_manager;
  local_f18._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_f18);
  if (local_f08 != (code *)0x0) {
    (*local_f08)(&local_f18,&local_f18,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"underlay","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_14b8._M_unused._M_object = (void *)0x0;
  local_14b8._8_8_ = 0;
  local_14a8 = (code *)0x0;
  pcStack_14a0 = (code *)0x0;
  local_14b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_14b8._M_unused._0_8_ = beginUnderlayArray;
  *(undefined8 *)((long)local_14b8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_14b8._M_unused._0_8_ + 0x10) = this;
  pcStack_14a0 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_14a8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1248 = (code *)0x0;
  pcStack_1240 = (code *)0x0;
  local_1258._M_unused._M_object = (void *)0x0;
  local_1258._8_8_ = 0;
  local_1258._M_unused._M_object = operator_new(0x18);
  *(code **)local_1258._M_unused._0_8_ = endUnderlayArray;
  *(undefined8 *)((long)local_1258._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1258._M_unused._0_8_ + 0x10) = this;
  pcStack_1240 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1248 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginArray(this,(json_handler_t *)&local_14b8,(bare_handler_t *)&local_1258);
  if (local_1248 != (code *)0x0) {
    (*local_1248)(&local_1258,&local_1258,__destroy_functor);
  }
  if (local_14a8 != (code *)0x0) {
    (*local_14a8)(&local_14b8,&local_14b8,__destroy_functor);
  }
  local_14c8 = (code *)0x0;
  pcStack_14c0 = (code *)0x0;
  local_14d8._M_unused._M_object = (void *)0x0;
  local_14d8._8_8_ = 0;
  local_14d8._M_unused._M_object = operator_new(0x18);
  *(code **)local_14d8._M_unused._0_8_ = beginUnderlay;
  *(undefined8 *)((long)local_14d8._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_14d8._M_unused._0_8_ + 0x10) = this;
  pcStack_14c0 = std::
                 _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
                 ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(JSON),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)>_((anonymous_namespace)::Handlers_*,_std::_Placeholder<1>)>_>
               ::_M_manager;
  local_1268 = (code *)0x0;
  pcStack_1260 = (code *)0x0;
  local_1278._M_unused._M_object = (void *)0x0;
  local_1278._8_8_ = 0;
  local_1278._M_unused._M_object = operator_new(0x18);
  *(code **)local_1278._M_unused._0_8_ = endUnderlay;
  *(undefined8 *)((long)local_1278._M_unused._0_8_ + 8) = 0;
  *(Handlers **)((long)local_1278._M_unused._0_8_ + 0x10) = this;
  pcStack_1260 = std::
                 _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
                 ::_M_invoke;
  local_1268 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_((anonymous_namespace)::Handlers::*)()>_((anonymous_namespace)::Handlers_*)>_>
               ::_M_manager;
  beginDict(this,(json_handler_t *)&local_14d8,(bare_handler_t *)&local_1278);
  if (local_1268 != (code *)0x0) {
    (*local_1268)(&local_1278,&local_1278,__destroy_functor);
  }
  if (local_14c8 != (code *)0x0) {
    (*local_14c8)(&local_14d8,&local_14d8,__destroy_functor);
  }
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"file","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  ignoreItem(this);
  psVar3 = (this->json_handlers).
           super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->json_handlers).
  super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"password","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1508._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:589:18)>
       ::_M_invoke;
  local_14f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:589:18)>
       ::_M_manager;
  local_1508._0_8_ = this;
  addParameter(this,(param_handler_t *)local_1508);
  if ((code *)local_14f8._0_8_ != (code *)0x0) {
    (*(code *)local_14f8._0_8_)(local_1508,local_1508,3);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"from","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_f38._8_8_ = 0;
  pcStack_f20 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:473:14)>
                ::_M_invoke;
  local_f28 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:473:14)>
              ::_M_manager;
  local_f38._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_f38);
  if (local_f28 != (code *)0x0) {
    (*local_f28)(&local_f38,&local_f38,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"repeat","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_f58._8_8_ = 0;
  pcStack_f40 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:476:14)>
                ::_M_invoke;
  local_f48 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:476:14)>
              ::_M_manager;
  local_f58._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_f58);
  if (local_f48 != (code *)0x0) {
    (*local_f48)(&local_f58,&local_f58,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"to","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_f78._8_8_ = 0;
  pcStack_f60 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:479:14)>
                ::_M_invoke;
  local_f68 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:479:14)>
              ::_M_manager;
  local_f78._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_f78);
  if (local_f68 != (code *)0x0) {
    (*local_f68)(&local_f78,&local_f78,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = *ppsVar1;
  *ppJVar2 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"warningExit0","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_f98._8_8_ = 0;
  pcStack_f80 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:484:9)>
                ::_M_invoke;
  local_f88 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:484:9)>
              ::_M_manager;
  local_f98._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_f98);
  if (local_f88 != (code *)0x0) {
    (*local_f88)(&local_f98,&local_f98,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"jobJsonFile","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_fb8._8_8_ = 0;
  pcStack_fa0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:487:14)>
                ::_M_invoke;
  local_fa8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:487:14)>
              ::_M_manager;
  local_fb8._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_fb8);
  if (local_fa8 != (code *)0x0) {
    (*local_fa8)(&local_fb8,&local_fb8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1508,"preserveUnreferencedResources","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_fd8._8_8_ = 0;
  pcStack_fc0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:490:9)>
                ::_M_invoke;
  local_fc8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:490:9)>
              ::_M_manager;
  local_fd8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_fd8);
  if (local_fc8 != (code *)0x0) {
    (*local_fc8)(&local_fd8,&local_fd8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"requiresPassword","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_ff8._8_8_ = 0;
  pcStack_fe0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:493:9)>
                ::_M_invoke;
  local_fe8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:493:9)>
              ::_M_manager;
  local_ff8._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_ff8);
  if (local_fe8 != (code *)0x0) {
    (*local_fe8)(&local_ff8,&local_ff8,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  *ppJVar2 = (*ppsVar1)[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1508._0_8_ = (JSONHandler *)local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"isEncrypted","");
  pushKey(this,(string *)local_1508);
  if ((JSONHandler *)local_1508._0_8_ != (JSONHandler *)local_14f8) {
    operator_delete((void *)local_1508._0_8_,(ulong)(local_14f8._0_8_ + 1));
  }
  local_1018._8_8_ = 0;
  pcStack_1000 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:496:9)>
                 ::_M_invoke;
  local_1008 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:496:9)>
               ::_M_manager;
  local_1018._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1018);
  if (local_1008 != (code *)0x0) {
    (*local_1008)(&local_1018,&local_1018,__destroy_functor);
  }
  psVar3 = *ppsVar1;
  *ppsVar1 = psVar3 + -1;
  p_Var4 = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  psVar3 = (this->json_handlers).
           super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->jh = psVar3[-1].super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((long)psVar3 -
      (long)(this->json_handlers).
            super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x10) {
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"QPDFJob_json: json_handlers size != 1 at end");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Handlers::initHandlers()
{
    this->json_handlers.emplace_back(std::make_shared<JSONHandler>());
    this->jh = this->json_handlers.back().get();
    jh->addDictHandlers(
        [](std::string const&, JSON) {},
        [this](std::string const&) {
            if (!this->partial) {
                c_main->checkConfiguration();
            }
        });

#include <qpdf/auto_job_json_init.hh>

    // We have `bits` in the CLI but not in the JSON. Reference this variable so it doesn't generate
    // a warning.
    [](char const**) {}(enc_bits_choices);

    if (this->json_handlers.size() != 1) {
        throw std::logic_error("QPDFJob_json: json_handlers size != 1 at end");
    }
}